

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordinationNumber.cpp
# Opt level: O2

void __thiscall OpenMD::CoordinationNumber::writeOutput(CoordinationNumber *this)

{
  char cVar1;
  ostream *poVar2;
  uint uVar3;
  ulong uVar4;
  Revision r;
  string local_248;
  ofstream ofs;
  
  std::ofstream::ofstream(&ofs,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_bin)
  ;
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    poVar2 = std::operator<<((ostream *)&ofs,"# ");
    poVar2 = std::operator<<(poVar2,(string *)&(this->super_StaticAnalyser).analysisType_);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&ofs,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(&local_248,&r);
    poVar2 = std::operator<<(poVar2,(string *)&local_248);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_248);
    poVar2 = std::operator<<((ostream *)&ofs,"# ");
    Revision::getBuildDate_abi_cxx11_(&local_248,&r);
    poVar2 = std::operator<<(poVar2,(string *)&local_248);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_248);
    poVar2 = std::operator<<((ostream *)&ofs,"# selection script1: \"");
    std::operator<<(poVar2,(string *)&this->sele1_);
    poVar2 = std::operator<<((ostream *)&ofs,"\"\tselection script2: \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->sele2_);
    std::operator<<(poVar2,"\"\n");
    if ((this->super_StaticAnalyser).paramString_._M_string_length != 0) {
      poVar2 = std::operator<<((ostream *)&ofs,"# parameters: ");
      poVar2 = std::operator<<(poVar2,(string *)&(this->super_StaticAnalyser).paramString_);
      std::operator<<(poVar2,"\n");
    }
    for (uVar3 = 0; uVar4 = (ulong)uVar3,
        uVar4 < (ulong)((long)(this->histogram_).super__Vector_base<double,_std::allocator<double>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->histogram_).super__Vector_base<double,_std::allocator<double>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
      poVar2 = std::ostream::_M_insert<double>((double)uVar4 * this->delta_);
      std::operator<<(poVar2,"\t");
      poVar2 = std::ostream::_M_insert<double>
                         ((this->histogram_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar4] / this->delta_);
      std::operator<<(poVar2,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void CoordinationNumber::writeOutput() {
    std::ofstream ofs(outputFilename_.c_str(), std::ios::binary);

    if (ofs.is_open()) {
      Revision r;
      RealType binValue(0.0);

      ofs << "# " << getAnalysisType() << "\n";
      ofs << "# OpenMD " << r.getFullRevision() << "\n";
      ofs << "# " << r.getBuildDate() << "\n";
      ofs << "# selection script1: \"" << sele1_;
      ofs << "\"\tselection script2: \"" << sele2_ << "\"\n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      for (unsigned int n = 0; n < histogram_.size(); n++) {
        binValue = n * delta_;
        ofs << binValue << "\t" << histogram_[n] / delta_ << "\n";
      }
    }
    ofs.close();
  }